

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O3

int findreplaceengine(bstring b,const_bstring find,const_bstring repl,int pos,instr_fnptr instr)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uchar *puVar4;
  undefined1 *puVar5;
  uchar *puVar6;
  ulong uVar7;
  int iVar8;
  size_t __n;
  long lVar9;
  uint uVar10;
  long lVar11;
  uint uVar12;
  ulong uVar13;
  long lVar14;
  bool bVar15;
  int static_d [33];
  const_bstring local_f8;
  bstring local_f0;
  undefined1 *local_e8;
  undefined1 local_b8 [136];
  
  iVar8 = -1;
  if (b == (bstring)0x0) {
    return -1;
  }
  uVar13 = (ulong)(uint)pos;
  puVar4 = b->data;
  if (find == (const_bstring)0x0 || puVar4 == (uchar *)0x0) {
    return -1;
  }
  if (repl == (const_bstring)0x0 || find->data == (uchar *)0x0) {
    return -1;
  }
  puVar6 = repl->data;
  if (pos < 0 || puVar6 == (uchar *)0x0) {
    return -1;
  }
  iVar2 = find->slen;
  if (iVar2 < 1) {
    return -1;
  }
  if (b->mlen < 1) {
    return -1;
  }
  uVar10 = b->slen;
  if ((uint)b->mlen < uVar10) {
    return -1;
  }
  iVar3 = repl->slen;
  if (iVar3 < 0) {
    return -1;
  }
  if (pos <= (int)(uVar10 - iVar2)) {
    lVar9 = (long)find->data - (long)puVar4;
    local_f8 = find;
    if (lVar9 < (long)(ulong)uVar10 && pos - iVar2 < lVar9) {
      local_f8 = bstrcpy(find);
      if (local_f8 == (bstring)0x0) {
        return -1;
      }
      puVar6 = repl->data;
      puVar4 = b->data;
      iVar3 = repl->slen;
    }
    local_f0 = repl;
    if (((long)(pos - iVar3) < (long)puVar6 - (long)puVar4) &&
       ((long)puVar6 - (long)puVar4 < (long)b->slen)) {
      local_f0 = bstrcpy(repl);
      if (local_f0 == (bstring)0x0) {
        if (local_f8 == find) {
          return -1;
        }
        goto LAB_00135956;
      }
      iVar3 = local_f0->slen;
    }
    uVar10 = local_f8->slen - iVar3;
    if (uVar10 == 0) {
      for (uVar10 = (*instr)(b,pos,local_f8); -1 < (int)uVar10;
          uVar10 = (*instr)(b,uVar10 + local_f8->slen,local_f8)) {
        memcpy(b->data + uVar10,local_f0->data,(long)local_f0->slen);
      }
    }
    else {
      if ((int)uVar10 < 1) {
        local_e8 = local_b8;
        uVar1 = 0x20;
        iVar2 = 0;
        uVar7 = 0;
        do {
          iVar8 = (*instr)(b,(int)uVar13,local_f8);
          if (iVar8 < 0) {
            iVar8 = b->slen;
            *(int *)(local_e8 + (uVar7 & 0xffffffff) * 4) = iVar8;
            iVar3 = balloc(b,(iVar8 - iVar2) + 1);
            iVar8 = -1;
            if (iVar3 == 0) {
              iVar8 = b->slen - iVar2;
              b->slen = iVar8;
              if (uVar7 != 0) {
                lVar9 = uVar7 + 1;
                lVar14 = (long)-iVar2;
                do {
                  lVar11 = (long)local_f8->slen +
                           (long)*(int *)(local_e8 + (ulong)((int)lVar9 - 2) * 4);
                  iVar8 = *(int *)(local_e8 + lVar9 * 4 + -4) - (int)lVar11;
                  if (iVar8 != 0) {
                    memmove(b->data + lVar11 + lVar14,b->data + lVar11,(long)iVar8);
                  }
                  __n = (size_t)local_f0->slen;
                  if (__n != 0) {
                    memmove(b->data + lVar14 + (lVar11 - __n),local_f0->data,__n);
                  }
                  lVar14 = lVar14 + (int)uVar10;
                  lVar9 = lVar9 + -1;
                } while (1 < lVar9);
                iVar8 = b->slen;
              }
              b->data[iVar8] = '\0';
              iVar8 = 0;
            }
            goto LAB_0013590b;
          }
          if ((long)(int)(uVar1 - 1) <= (long)uVar7) {
            if (0x7ffffff < uVar1) {
              iVar8 = -1;
              goto LAB_0013590b;
            }
            puVar5 = (undefined1 *)0x0;
            if (local_b8 != local_e8) {
              puVar5 = local_e8;
            }
            local_e8 = puVar5;
            puVar5 = (undefined1 *)realloc(local_e8,(ulong)(uVar1 << 4));
            if (puVar5 == (undefined1 *)0x0) {
              iVar8 = -1;
              goto LAB_00135938;
            }
            uVar1 = uVar1 * 2;
            bVar15 = local_e8 == (undefined1 *)0x0;
            local_e8 = puVar5;
            if (bVar15) {
              memcpy(puVar5,local_b8,0x84);
            }
          }
          *(int *)(local_e8 + uVar7 * 4) = iVar8;
          uVar7 = uVar7 + 1;
          iVar2 = iVar2 + uVar10;
          uVar12 = iVar8 + local_f8->slen;
          uVar13 = (ulong)uVar12;
        } while (-1 < (int)uVar12);
        iVar8 = -1;
LAB_0013590b:
        if (local_b8 != local_e8) {
LAB_00135938:
          free(local_e8);
        }
        if (local_f8 != find) {
          bdestroy(local_f8);
        }
        local_f8 = local_f0;
        if (local_f0 == repl) {
          return iVar8;
        }
LAB_00135956:
        bdestroy(local_f8);
        return iVar8;
      }
      uVar1 = (*instr)(b,pos,local_f8);
      if (-1 < (int)uVar1) {
        iVar8 = 0;
        lVar9 = 0;
        do {
          if (lVar9 != 0) {
            iVar2 = (int)uVar13;
            if (uVar1 - iVar2 != 0 && iVar2 <= (int)uVar1) {
              memmove(b->data + iVar2 + lVar9,b->data + iVar2,(long)(int)(uVar1 - iVar2));
            }
          }
          if ((long)local_f0->slen != 0) {
            memcpy(b->data + lVar9 + (ulong)uVar1,local_f0->data,(long)local_f0->slen);
          }
          uVar13 = (long)(int)uVar1 + (long)local_f8->slen;
          iVar2 = (int)uVar13;
          uVar1 = (*instr)(b,iVar2,local_f8);
          lVar9 = lVar9 - (ulong)uVar10;
          iVar8 = iVar8 + uVar10;
        } while (-1 < (int)uVar1);
        iVar3 = b->slen;
        if (iVar3 - iVar2 != 0 && iVar2 <= iVar3) {
          memmove(b->data + uVar13 + -(-lVar9 & 0xffffffffU),b->data + uVar13,(long)(iVar3 - iVar2))
          ;
          iVar3 = b->slen;
        }
        b->slen = iVar3 - iVar8;
        b->data[iVar3 - iVar8] = '\0';
      }
    }
    if (local_f8 != find) {
      bdestroy(local_f8);
    }
    if (local_f0 != repl) {
      bdestroy(local_f0);
    }
  }
  return 0;
}

Assistant:

static int findreplaceengine (bstring b, const_bstring find,
                              const_bstring repl, int pos,
                              instr_fnptr instr) {
int i, ret, slen, mlen, delta, acc;
int * d;
int static_d[INITIAL_STATIC_FIND_INDEX_COUNT+1]; /* This +1 is for LINT. */
ptrdiff_t pd;
bstring auxf = (bstring) find;
bstring auxr = (bstring) repl;

	if (b == NULL || b->data == NULL || find == NULL ||
		find->data == NULL || repl == NULL || repl->data == NULL ||
		pos < 0 || find->slen <= 0 || b->mlen <= 0 || b->slen > b->mlen ||
		b->slen < 0 || repl->slen < 0) return BSTR_ERR;
	if (pos > b->slen - find->slen) return BSTR_OK;

	/* Alias with find string */
	pd = (ptrdiff_t) (find->data - b->data);
	if ((ptrdiff_t) (pos - find->slen) < pd && pd < (ptrdiff_t) b->slen) {
		if (NULL == (auxf = bstrcpy (find))) return BSTR_ERR;
	}

	/* Alias with repl string */
	pd = (ptrdiff_t) (repl->data - b->data);
	if ((ptrdiff_t) (pos - repl->slen) < pd && pd < (ptrdiff_t) b->slen) {
		if (NULL == (auxr = bstrcpy (repl))) {
			if (auxf != find) bdestroy (auxf);
			return BSTR_ERR;
		}
	}

	delta = auxf->slen - auxr->slen;

	/* in-place replacement since find and replace strings are of equal
	   length */
	if (delta == 0) {
		while ((pos = instr (b, pos, auxf)) >= 0) {
			bstr__memcpy (b->data + pos, auxr->data, auxr->slen);
			pos += auxf->slen;
		}
		if (auxf != find) bdestroy (auxf);
		if (auxr != repl) bdestroy (auxr);
		return BSTR_OK;
	}

	/* shrinking replacement since auxf->slen > auxr->slen */
	if (delta > 0) {
		acc = 0;

		while ((i = instr (b, pos, auxf)) >= 0) {
			if (acc && i > pos)
				bstr__memmove (b->data + pos - acc, b->data + pos, i - pos);
			if (auxr->slen)
				bstr__memcpy (b->data + i - acc, auxr->data, auxr->slen);
			acc += delta;
			pos = i + auxf->slen;
		}

		if (acc) {
			i = b->slen;
			if (i > pos)
				bstr__memmove (b->data + pos - acc, b->data + pos, i - pos);
			b->slen -= acc;
			b->data[b->slen] = (unsigned char) '\0';
		}

		if (auxf != find) bdestroy (auxf);
		if (auxr != repl) bdestroy (auxr);
		return BSTR_OK;
	}

	/* expanding replacement since find->slen < repl->slen.  Its a lot
	   more complicated.  This works by first finding all the matches and
	   storing them to a growable array, then doing at most one resize of
	   the destination bstring and then performing the direct memory transfers
	   of the string segment pieces to form the final result. The growable
	   array of matches uses a deferred doubling reallocing strategy.  What
	   this means is that it starts as a reasonably fixed sized auto array in
	   the hopes that many if not most cases will never need to grow this
	   array.  But it switches as soon as the bounds of the array will be
	   exceeded.  An extra find result is always appended to this array that
	   corresponds to the end of the destination string, so slen is checked
	   against mlen - 1 rather than mlen before resizing.
	*/

	mlen = INITIAL_STATIC_FIND_INDEX_COUNT;
	d = (int *) static_d; /* Avoid malloc for trivial/initial cases */
	acc = slen = 0;

	while ((pos = instr (b, pos, auxf)) >= 0) {
		if (slen >= mlen - 1) {
			int *t;
			int sl;
			/* Overflow */
			if (mlen > (INT_MAX / sizeof(int *)) / 2) {
				ret = BSTR_ERR;
				goto done;
			}
			mlen += mlen;
			sl = sizeof (int *) * mlen;
			if (static_d == d) d = NULL; /* static_d cannot be realloced */
			if (NULL == (t = (int *) bstr__realloc (d, sl))) {
				ret = BSTR_ERR;
				goto done;
			}
			if (NULL == d) bstr__memcpy (t, static_d, sizeof (static_d));
			d = t;
		}
		d[slen] = pos;
		slen++;
		acc -= delta;
		pos += auxf->slen;
		if (pos < 0 || acc < 0) {
			ret = BSTR_ERR;
			goto done;
		}
	}

	/* slen <= INITIAL_STATIC_INDEX_COUNT-1 or mlen-1 here. */
	d[slen] = b->slen;

	if (BSTR_OK == (ret = balloc (b, b->slen + acc + 1))) {
		b->slen += acc;
		for (i = slen-1; i >= 0; i--) {
			int s, l;
			s = d[i] + auxf->slen;
			l = d[i+1] - s; /* d[slen] may be accessed here. */
			if (l) {
				bstr__memmove (b->data + s + acc, b->data + s, l);
			}
			if (auxr->slen) {
				bstr__memmove (b->data + s + acc - auxr->slen,
				               auxr->data, auxr->slen);
			}
			acc += delta;
		}
		b->data[b->slen] = (unsigned char) '\0';
	}

	done:;
	if (static_d != d) bstr__free (d);
	if (auxf != find) bdestroy (auxf);
	if (auxr != repl) bdestroy (auxr);
	return ret;
}